

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedLiteralEvaluator.cpp
# Opt level: O0

Evaluator * __thiscall
Kernel::InterpretedLiteralEvaluator::
getEvaluator<Kernel::InterpretedLiteralEvaluator::getFuncEvaluator(unsigned_int)::__0>
          (void *param_1,uint param_2,
          DArray<Kernel::InterpretedLiteralEvaluator::Evaluator_*> *param_3)

{
  bool bVar1;
  size_t sVar2;
  anon_class_1_0_00000001 *paVar3;
  Evaluator **ppEVar4;
  DArray<Kernel::InterpretedLiteralEvaluator::Evaluator_*> *unaff_retaddr;
  Evaluator *ev;
  Iterator evit;
  uint i;
  uint newSz;
  uint oldSz;
  Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*> *in_stack_ffffffffffffff98;
  anon_class_1_0_00000001 *in_stack_ffffffffffffffa0;
  RefIterator local_40;
  uint local_2c;
  uint local_28;
  uint local_24;
  DArray<Kernel::InterpretedLiteralEvaluator::Evaluator_*> *local_20;
  uint local_14;
  void *local_10;
  size_t in_stack_fffffffffffffff8;
  
  local_20 = param_3;
  local_14 = param_2;
  local_10 = param_1;
  sVar2 = Lib::DArray<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::size(param_3);
  if (sVar2 <= param_2) {
    sVar2 = Lib::DArray<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::size(local_20);
    local_24 = (uint)sVar2;
    local_28 = local_14 + 1;
    Lib::DArray<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::expand
              (unaff_retaddr,in_stack_fffffffffffffff8);
    for (local_2c = local_24; local_2c < local_28; local_2c = local_2c + 1) {
      Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::Iterator::Iterator
                ((Iterator *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      do {
        bVar1 = Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::RefIterator::hasNext
                          (&local_40);
        if (!bVar1) goto LAB_00877652;
        paVar3 = (anon_class_1_0_00000001 *)
                 Lib::Stack<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::Iterator::next
                           ((Iterator *)0x87760c);
        bVar1 = getFuncEvaluator::anon_class_1_0_00000001::operator()
                          (in_stack_ffffffffffffffa0,(Evaluator *)in_stack_ffffffffffffff98,0);
      } while (!bVar1);
      ppEVar4 = Lib::DArray<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::operator[]
                          (local_20,(ulong)local_2c);
      *ppEVar4 = (Evaluator *)paVar3;
      in_stack_ffffffffffffffa0 = paVar3;
LAB_00877652:
    }
  }
  ppEVar4 = Lib::DArray<Kernel::InterpretedLiteralEvaluator::Evaluator_*>::operator[]
                      (local_20,(ulong)local_14);
  return *ppEVar4;
}

Assistant:

InterpretedLiteralEvaluator::Evaluator* InterpretedLiteralEvaluator::getEvaluator(unsigned functor, DArray<Evaluator*>& evaluators, Fn canEval) 
{
  if (functor >= evaluators.size()) {
    unsigned oldSz = evaluators.size();
    unsigned newSz = functor + 1 ;
    evaluators.expand(newSz);
    for (unsigned i=oldSz; i<newSz; i++) {
        EvalStack::Iterator evit(_evals);
	while (evit.hasNext()) {
          Evaluator* ev = evit.next();
          // we only set the evaluator if it has not yet been set
	  if (canEval(ev, i)) {
	    evaluators[i] = ev;
            goto break_inner;
	  }
	}
break_inner:;
    }
  }
  return evaluators[functor];
}